

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_strconv.cpp
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
ritobin::strconv_impl::StringIterator::match_str
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          StringIterator *this,string_view what)

{
  bool bVar1;
  size_type __n;
  StringIterator *this_local;
  string_view what_local;
  
  what_local._M_len = (size_t)what._M_str;
  this_local = (StringIterator *)what._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with(&this->data_,what);
  if (bVar1) {
    __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&this->data_,__n);
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
    optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  else {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> match_str(std::string_view what) noexcept {
            if (data_.starts_with(what)) {
                data_.remove_prefix(what.size());
                return what;
            } else {
                return std::nullopt;
            }
        }